

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf2.c
# Opt level: O0

void gf2SqrPentanomial(word *b,word *a,qr_o *f,void *stack)

{
  word *in_RCX;
  long in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *prod;
  
  ppSqr(in_RCX,in_RSI,*(size_t *)(in_RDX + 0x30),in_RCX + *(long *)(in_RDX + 0x30) * 2);
  gf2RedPentanomial(in_RCX,*(size_t *)(in_RDX + 0x30),*(gf2_pentanom_st **)(in_RDX + 0x28));
  wwCopy(in_RDI,in_RCX,*(size_t *)(in_RDX + 0x30));
  return;
}

Assistant:

static void gf2SqrPentanomial(word b[], const word a[], const qr_o* f, 
	void* stack)
{
	word* prod = (word*)stack;
	stack = prod + 2 * f->n;
	ASSERT(gf2IsOperable(f));
	ASSERT(gf2IsIn(a, f));
	ppSqr(prod, a, f->n, stack);
	gf2RedPentanomial(prod, f->n, (const gf2_pentanom_st*)f->params);
	wwCopy(b, prod, f->n);
}